

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> * __thiscall
jsoncons::jsonpath::detail::
eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
::create_json<jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag,std::allocator<char>>
          (eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
           *this,json_array_arg_t *args,semantic_tag *args_1,allocator<char> *args_2)

{
  __single_object temp;
  unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
  local_20;
  
  std::
  make_unique<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag,std::allocator<char>>
            ((json_array_arg_t *)&local_20,(semantic_tag *)args,(allocator<char> *)args_1);
  std::
  vector<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,std::allocator<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
            ((vector<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>,std::allocator<std::unique_ptr<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
              *)(this + 8),&local_20);
  std::
  unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
  ::~unique_ptr(&local_20);
  return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
         (tuple<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
          )local_20._M_t.
           super___uniq_ptr_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
}

Assistant:

Json* create_json(Args&& ... args)
        {
            auto temp = jsoncons::make_unique<Json>(std::forward<Args>(args)...);
            Json* ptr = temp.get();
            temp_json_values_.push_back(std::move(temp));
            return ptr;
        }